

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  mode_t mVar6;
  uint uVar7;
  int *piVar8;
  int64_t iVar9;
  char *pcVar10;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar11;
  archive_string *paVar12;
  ulong uVar13;
  mtree_entry *pmVar14;
  mtree_entry *pmVar15;
  size_t sVar16;
  byte *pbVar17;
  long lVar18;
  size_t sVar19;
  char *pcVar20;
  size_t sVar21;
  long lVar22;
  byte *pbVar23;
  char *pcVar24;
  byte *pbVar25;
  ulong uVar26;
  mtree *pmVar27;
  stat *__buf;
  undefined1 *puVar28;
  timespec *ptVar29;
  mtree *pmVar30;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_120;
  archive_read *local_118;
  uint local_10c;
  mtree_entry *local_108;
  mtree *local_100;
  mtree_entry *local_f8;
  byte *local_f0;
  byte *local_e8;
  long local_e0;
  archive_entry *local_d8;
  mtree_entry *local_d0;
  archive_entry *local_c8;
  stat local_c0;
  
  pmVar30 = (mtree *)a->format->data;
  local_118 = a;
  local_c8 = entry;
  if (-1 < pmVar30->fd) {
    close(pmVar30->fd);
    pmVar30->fd = -1;
  }
  local_100 = pmVar30;
  if (pmVar30->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    pmVar30->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_d0 = (mtree_entry *)&pmVar30->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    pmVar30->archive_format = 0x80000;
    pmVar30->archive_format_name = "mtree";
    local_120 = (archive_entry *)0x0;
    detect_form(local_118,(int *)&local_d8);
    local_e0 = 1;
    local_108 = (mtree_entry *)0x0;
LAB_0013730d:
    __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      uVar26 = 0;
      lVar22 = 0;
LAB_00137332:
      if (-1 < (long)local_c0.st_dev) {
        pvVar11 = memchr(__s,10,local_c0.st_dev);
        pmVar27 = local_100;
        if (pvVar11 != (void *)0x0) {
          local_c0.st_dev = (long)pvVar11 + (1 - (long)__s);
        }
        if ((long)(local_c0.st_dev + uVar26) < 0x10000) {
          paVar12 = archive_string_ensure(&local_100->line,local_c0.st_dev + uVar26 + 1);
          if (paVar12 != (archive_string *)0x0) {
            memcpy((pmVar27->line).s + uVar26,__s,local_c0.st_dev);
            __archive_read_consume(local_118,local_c0.st_dev);
            uVar26 = uVar26 + local_c0.st_dev;
            (pmVar27->line).s[uVar26] = '\0';
            pmVar27 = (mtree *)(pmVar27->line).s;
            pbVar25 = (byte *)((long)&(pmVar27->line).s + lVar22);
            do {
              bVar1 = *pbVar25;
              pbVar17 = pbVar25;
              if (bVar1 < 0x5c) {
                if (bVar1 == 0) goto LAB_00137431;
                if (bVar1 == 10) goto LAB_00137496;
                if (bVar1 == 0x23) {
                  if (pvVar11 == (void *)0x0) goto LAB_00137431;
                  goto LAB_00137496;
                }
              }
              else if (bVar1 == 0x5c) {
                pbVar23 = pbVar25 + 1;
                bVar1 = pbVar25[1];
                pbVar17 = pbVar23;
                if (bVar1 != 0x5c) {
                  if (bVar1 == 0) goto LAB_00137431;
                  pbVar17 = pbVar25;
                  if (bVar1 == 10) goto LAB_00137414;
                }
              }
              pbVar25 = pbVar17 + 1;
            } while( true );
          }
          iVar4 = 0xc;
          pcVar10 = "Can\'t allocate working buffer";
        }
        else {
          iVar4 = 0x54;
          pcVar10 = "Line too long";
        }
        archive_set_error(&local_118->archive,iVar4,pcVar10);
      }
      uVar26 = 0xffffffffffffffe2;
      pmVar27 = pmVar30;
      goto LAB_00137496;
    }
LAB_00137459:
    uVar26 = 0;
    pmVar27 = pmVar30;
LAB_00137496:
    iVar4 = (int)local_d8;
    pmVar30 = local_100;
    if (uVar26 == 0) {
      local_100->this_entry = local_100->entries;
      free_options((mtree_option *)local_120);
      iVar4 = 0;
      goto LAB_0013797d;
    }
    if (-1 < (long)uVar26) {
      for (lVar22 = 0; uVar13 = (ulong)*(byte *)((long)&(pmVar27->line).s + lVar22), uVar13 < 0x30;
          lVar22 = lVar22 + 1) {
        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
          if ((0x800002401U >> (uVar13 & 0x3f) & 1) != 0) goto LAB_00137937;
          if (uVar13 == 0x2f) {
            pcVar10 = (char *)((long)&(pmVar27->line).s + lVar22);
            iVar4 = strncmp(pcVar10,"/set",4);
            if (iVar4 == 0) {
              cVar2 = *(char *)((long)&(pmVar27->line).s + lVar22 + 4);
              if ((cVar2 == ' ') || (cVar2 == '\t')) {
                pcVar10 = (char *)((long)&(pmVar27->line).s + lVar22 + 4);
                goto LAB_0013762f;
              }
            }
            else {
              iVar4 = strncmp(pcVar10,"/unset",6);
              if ((iVar4 == 0) &&
                 ((cVar2 = *(char *)((long)&(pmVar27->line).s + lVar22 + 6), cVar2 == ' ' ||
                  (cVar2 == '\t')))) {
                pcVar20 = (char *)((long)&(pmVar27->line).s + lVar22 + 6);
                pcVar10 = strchr(pcVar20,0x3d);
                if (pcVar10 != (char *)0x0) {
                  iVar4 = -1;
                  pcVar10 = "/unset shall not contain `=\'";
                  goto LAB_001376bf;
                }
                sVar16 = strspn(pcVar20," \t\r\n");
                uVar26 = 0;
                if (*(char *)((long)&(pmVar27->line).s + lVar22 + 6 + sVar16) != '\0') {
                  pcVar10 = (char *)((long)&(pmVar27->line).s + lVar22 + sVar16 + 6);
                  do {
                    sVar16 = strcspn(pcVar10," \t\r\n");
                    if ((sVar16 == 3) && (iVar4 = strncmp(pcVar10,"all",3), iVar4 == 0)) {
                      free_options((mtree_option *)local_120);
                      local_120 = (archive_entry *)0x0;
                    }
                    else {
                      remove_option((mtree_option **)&local_120,pcVar10,sVar16);
                    }
                    pcVar20 = pcVar10 + sVar16;
                    sVar16 = strspn(pcVar20," \t\r\n");
                    pcVar10 = pcVar20 + sVar16;
                  } while (pcVar20[sVar16] != '\0');
                }
                goto LAB_00137932;
              }
            }
            archive_set_error(&local_118->archive,0x54,"Can\'t parse line %ju",local_e0);
            free_options((mtree_option *)local_120);
            iVar4 = -0x1e;
            pmVar30 = local_100;
            goto LAB_0013797d;
          }
          break;
        }
      }
      pmVar14 = (mtree_entry *)malloc(0x20);
      if (pmVar14 != (mtree_entry *)0x0) {
        pbVar25 = (byte *)((long)&(pmVar27->line).s + lVar22);
        sVar16 = uVar26 - lVar22;
        *(undefined8 *)((long)&pmVar14->options + 2) = 0;
        *(undefined8 *)((long)&pmVar14->name + 2) = 0;
        pmVar14->next = (mtree_entry *)0x0;
        pmVar14->options = (mtree_option *)0x0;
        pmVar15 = local_108;
        if (local_108 == (mtree_entry *)0x0) {
          pmVar15 = local_d0;
        }
        pmVar15->next = pmVar14;
        local_f8 = pmVar14;
        if (iVar4 == 0) {
          sVar19 = strcspn((char *)pbVar25," \t\r\n");
          local_f0 = pbVar25 + sVar19 + sVar16;
          pbVar17 = pbVar25;
          pbVar25 = pbVar25 + sVar19;
          sVar16 = sVar19;
        }
        else {
          pbVar23 = pbVar25 + (sVar16 - 1);
          if (0 < (long)sVar16) {
            do {
              if ((0x20 < (ulong)*pbVar23) || ((0x100002600U >> ((ulong)*pbVar23 & 0x3f) & 1) == 0))
              goto LAB_0013779e;
              pbVar23 = pbVar23 + -1;
              bVar3 = 1 < (long)sVar16;
              sVar16 = sVar16 - 1;
            } while (bVar3);
            sVar16 = 0;
            pbVar23 = (byte *)((long)pmVar27 + lVar22 + -1);
          }
LAB_0013779e:
          if ((long)sVar16 < 1) {
            pbVar17 = pbVar23;
            sVar16 = 0;
            local_f0 = pbVar23;
          }
          else {
            pbVar17 = pbVar23 + -sVar16;
            lVar18 = 0;
            do {
              if (((ulong)pbVar23[lVar18] < 0x21) &&
                 ((0x100002600U >> ((ulong)pbVar23[lVar18] & 0x3f) & 1) != 0)) {
                pbVar17 = pbVar23 + lVar18 + 1;
                sVar16 = -lVar18;
                local_f0 = pbVar23 + lVar18 + 1;
                break;
              }
              lVar18 = lVar18 + -1;
              local_f0 = pbVar17;
            } while (sVar16 + lVar18 != 0);
          }
        }
        pbVar23 = (byte *)malloc(sVar16 + 1);
        pmVar14 = local_f8;
        local_f8->name = (char *)pbVar23;
        if (pbVar23 == (byte *)0x0) {
          piVar8 = __errno_location();
          archive_set_error(&local_118->archive,*piVar8,"Can\'t allocate memory");
          uVar26 = 0xffffffe2;
          local_108 = pmVar14;
          goto LAB_00137932;
        }
        local_108 = (mtree_entry *)&local_f8->options;
        local_e8 = pbVar23;
        memcpy(pbVar23,pbVar17,sVar16);
        local_e8[sVar16] = 0;
        parse_escapes((char *)local_e8,pmVar14);
        puVar28 = (undefined1 *)&local_120;
        do {
          puVar28 = *(undefined1 **)puVar28;
          if (puVar28 == (undefined1 *)0x0) goto LAB_0013789e;
          pcVar10 = *(char **)((long)puVar28 + 8);
          sVar16 = strlen(pcVar10);
          uVar7 = add_option(local_118,(mtree_option **)local_108,pcVar10,sVar16);
        } while (uVar7 == 0);
        goto LAB_00137925;
      }
      piVar8 = __errno_location();
      iVar4 = *piVar8;
      pcVar10 = "Can\'t allocate memory";
LAB_001376bf:
      archive_set_error(&local_118->archive,iVar4,pcVar10);
      uVar26 = 0xffffffe2;
      goto LAB_00137932;
    }
LAB_00137952:
    iVar4 = (int)uVar26;
    free_options((mtree_option *)local_120);
    pmVar30 = local_100;
LAB_0013797d:
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  (local_118->archive).archive_format = pmVar30->archive_format;
  (local_118->archive).archive_format_name = pmVar30->archive_format_name;
  pmVar14 = pmVar30->this_entry;
  if (pmVar14 != (mtree_entry *)0x0) {
    local_108 = (mtree_entry *)&pmVar30->current_dir;
    do {
      iVar4 = strcmp(pmVar14->name,"..");
      if (iVar4 == 0) {
        pmVar14->used = '\x01';
        sVar21 = (pmVar30->current_dir).length;
        if (sVar21 != 0) {
          pcVar10 = (pmVar30->current_dir).s;
          pcVar20 = pcVar10 + sVar21;
          do {
            pcVar24 = pcVar20;
            pcVar20 = pcVar24 + -1;
            if (pcVar20 < pcVar10) break;
          } while (*pcVar20 != '/');
          pcVar24 = pcVar24 + -2;
          if (pcVar20 < pcVar10) {
            pcVar24 = pcVar20;
          }
          (pmVar30->current_dir).length = (size_t)(pcVar24 + (1 - (long)pcVar10));
        }
      }
      if (pmVar14->used == '\0') {
        local_120 = local_c8;
        pmVar14->used = '\x01';
        archive_entry_set_filetype(local_c8,0x8000);
        archive_entry_set_size(local_120,0);
        (pmVar30->contents_name).length = 0;
        local_10c = 0;
        iVar4 = parse_line(local_118,local_120,pmVar30,pmVar14,(int *)&local_10c);
        pmVar15 = local_108;
        if (pmVar14->full == '\0') {
          sVar21 = (pmVar30->current_dir).length;
          if (sVar21 != 0) {
            archive_strcat((archive_string *)local_108,"/");
          }
          archive_strcat((archive_string *)pmVar15,pmVar14->name);
          archive_entry_copy_pathname(local_120,(char *)pmVar15->next);
          mVar6 = archive_entry_filetype(local_120);
          if (mVar6 != 0x4000) {
            (pmVar30->current_dir).length = sVar21;
          }
        }
        else {
          archive_entry_copy_pathname(local_120,pmVar14->name);
          for (pmVar15 = pmVar14->next; pmVar15 != (mtree_entry *)0x0; pmVar15 = pmVar15->next) {
            if (((pmVar15->full != '\0') && (pmVar15->used == '\0')) &&
               (iVar5 = strcmp(pmVar14->name,pmVar15->name), iVar5 == 0)) {
              pmVar15->used = '\x01';
              iVar5 = parse_line(local_118,local_120,pmVar30,pmVar15,(int *)&local_10c);
              if (iVar5 < iVar4) {
                iVar4 = iVar5;
              }
            }
          }
        }
        if (pmVar30->checkfs == '\0') {
LAB_001371f1:
          iVar9 = archive_entry_size(local_120);
          pmVar30->cur_size = iVar9;
          pmVar30->offset = 0;
          bVar3 = true;
          iVar5 = iVar4;
        }
        else {
          pmVar30->fd = -1;
          if ((pmVar30->contents_name).length == 0) {
            pcVar10 = archive_entry_pathname(local_120);
          }
          else {
            pcVar10 = (pmVar30->contents_name).s;
          }
          mVar6 = archive_entry_filetype(local_120);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x4000)) {
            iVar5 = open(pcVar10,0x80000);
            pmVar30->fd = iVar5;
            __archive_ensure_cloexec_flag(iVar5);
            if (pmVar30->fd == -1) {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((pmVar30->contents_name).length != 0)) {
                archive_set_error(&local_118->archive,*piVar8,"Can\'t open %s",pcVar10);
                iVar4 = -0x14;
              }
            }
          }
          if (pmVar30->fd < 0) {
            __buf = &local_c0;
            iVar5 = lstat(pcVar10,__buf);
            if (iVar5 == -1) goto LAB_00136fa6;
            ptVar29 = &local_c0.st_mtim;
          }
          else {
            __buf = &local_c0;
            iVar5 = fstat(pmVar30->fd,__buf);
            ptVar29 = &local_c0.st_mtim;
            if (iVar5 == -1) {
              piVar8 = __errno_location();
              archive_set_error(&local_118->archive,*piVar8,"Could not fstat %s",pcVar10);
              pmVar30 = local_100;
              close(local_100->fd);
              pmVar30->fd = -1;
              iVar4 = -0x14;
LAB_00136fa6:
              ptVar29 = (timespec *)0x58;
              __buf = (stat *)0x0;
            }
          }
          if (__buf == (stat *)0x0) {
            bVar3 = false;
            pmVar30 = local_100;
            iVar5 = 0;
            if ((local_10c & 0x800) == 0) goto LAB_001371f1;
          }
          else {
            if (((((((__buf->st_mode & 0xf000) == 0x8000) &&
                   (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x8000)) ||
                  (((__buf->st_mode & 0xf000) == 0xa000 &&
                   (mVar6 = archive_entry_filetype(local_120), mVar6 == 0xa000)))) ||
                 (((~__buf->st_mode & 0xc000) == 0 &&
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0xc000)))) ||
                (((__buf->st_mode & 0xf000) == 0x2000 &&
                 (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x2000)))) ||
               (((((__buf->st_mode & 0xf000) == 0x6000 &&
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x6000)) ||
                 (((__buf->st_mode & 0xf000) == 0x4000 &&
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x4000)))) ||
                (((__buf->st_mode & 0xf000) == 0x1000 &&
                 (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x1000)))))) {
              uVar7 = local_10c;
              if (((local_10c & 0x1001) != 1) &&
                 ((mVar6 = archive_entry_filetype(local_120), mVar6 == 0x2000 ||
                  (mVar6 = archive_entry_filetype(local_120), mVar6 == 0x6000)))) {
                archive_entry_set_rdev(local_120,__buf->st_rdev);
              }
              if ((uVar7 & 0xc) == 0 || (uVar7 >> 0xc & 1) != 0) {
                archive_entry_set_gid(local_120,(ulong)__buf->st_gid);
              }
              if ((uVar7 & 0x600) == 0 || (uVar7 >> 0xc & 1) != 0) {
                archive_entry_set_uid(local_120,(ulong)__buf->st_uid);
              }
              if ((uVar7 & 0x1010) != 0x10) {
                archive_entry_set_mtime(local_120,(__buf->st_mtim).tv_sec,ptVar29->tv_nsec);
              }
              if ((uVar7 & 0x1020) != 0x20) {
                archive_entry_set_nlink(local_120,(uint)__buf->st_nlink);
              }
              pmVar30 = local_100;
              if ((uVar7 & 0x1040) != 0x40) {
                archive_entry_set_perm(local_120,__buf->st_mode);
              }
              if ((uVar7 & 0x1080) != 0x80) {
                archive_entry_set_size(local_120,__buf->st_size);
              }
              archive_entry_set_ino(local_120,__buf->st_ino);
              archive_entry_set_dev(local_120,__buf->st_dev);
              archive_entry_linkify(pmVar30->resolver,&local_120,&local_d8);
              goto LAB_001371f1;
            }
            pmVar30 = local_100;
            if (-1 < local_100->fd) {
              close(local_100->fd);
            }
            pmVar30->fd = -1;
            iVar5 = iVar4;
            if ((local_10c & 0x800) == 0) {
              bVar3 = true;
              if (iVar4 == 0) {
                pcVar10 = archive_entry_pathname(local_120);
                archive_set_error(&local_118->archive,-1,
                                  "mtree specification has different type for %s",pcVar10);
                iVar5 = -0x14;
                bVar3 = true;
              }
            }
            else {
              bVar3 = false;
            }
          }
        }
        if (bVar3) {
          return iVar5;
        }
      }
      pmVar14 = pmVar30->this_entry->next;
      pmVar30->this_entry = pmVar14;
    } while (pmVar14 != (mtree_entry *)0x0);
  }
  return 1;
LAB_00137414:
  memmove(pbVar25,pbVar23,(size_t)((long)pmVar27 + (uVar26 - (long)pbVar25) + 1));
  uVar26 = uVar26 - 1;
  pbVar25 = pbVar23;
LAB_00137431:
  lVar22 = (long)pbVar25 - (long)(local_100->line).s;
  __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
  if (__s == (void *)0x0) goto LAB_00137459;
  goto LAB_00137332;
  while( true ) {
    pcVar24 = pcVar10 + sVar16;
    sVar16 = strcspn(pcVar24," \t\r\n");
    pcVar10 = pcVar24 + sVar16;
    pcVar20 = strchr(pcVar24,0x3d);
    sVar21 = (long)pcVar20 - (long)pcVar24;
    if (pcVar10 < pcVar20) {
      sVar21 = sVar16;
    }
    remove_option((mtree_option **)&local_120,pcVar24,sVar21);
    uVar7 = add_option(local_118,(mtree_option **)&local_120,pcVar24,sVar16);
    if (uVar7 != 0) break;
LAB_0013762f:
    sVar16 = strspn(pcVar10," \t\r\n");
    if (pcVar10[sVar16] == '\0') {
      uVar26 = 0;
      goto LAB_00137932;
    }
  }
  uVar26 = (ulong)uVar7;
  goto LAB_00137932;
  while( true ) {
    sVar19 = strcspn((char *)pbVar25," \t\r\n");
    local_e8 = pbVar25 + sVar19;
    pbVar17 = (byte *)strchr((char *)pbVar25,0x3d);
    pmVar14 = local_108;
    sVar16 = (long)pbVar17 - (long)pbVar25;
    if (pbVar25 + sVar19 < pbVar17) {
      sVar16 = sVar19;
    }
    if (pbVar17 == (byte *)0x0) {
      sVar16 = sVar19;
    }
    remove_option((mtree_option **)local_108,(char *)pbVar25,sVar16);
    uVar7 = add_option(local_118,(mtree_option **)pmVar14,(char *)pbVar25,sVar19);
    pbVar25 = local_e8;
    if (uVar7 != 0) break;
LAB_0013789e:
    sVar16 = strspn((char *)pbVar25," \t\r\n");
    uVar26 = 0;
    if ((pbVar25[sVar16] == 0) || (pbVar25 = pbVar25 + sVar16, local_f0 <= pbVar25))
    goto LAB_00137928;
  }
LAB_00137925:
  uVar26 = (ulong)uVar7;
LAB_00137928:
  local_108 = local_f8;
LAB_00137932:
  if ((int)uVar26 != 0) goto LAB_00137952;
LAB_00137937:
  local_e0 = local_e0 + 1;
  pmVar30 = (mtree *)((long)&(pmVar27->line).s + lVar22);
  goto LAB_0013730d;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}